

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O0

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
     verifyExistingFile(string *filePath,Options *options)

{
  Reporter *siglen;
  uchar *in_RCX;
  Options *in_RSI;
  string *in_RDI;
  size_t in_R8;
  ExistingFile writer;
  ExistingFile *this;
  EVP_PKEY_CTX local_a8 [64];
  ApprovalWriter in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  ExistingFile *in_stack_ffffffffffffffc0;
  
  this = (ExistingFile *)&stack0xffffffffffffff98;
  ::std::__cxx11::string::string((string *)this,in_RDI);
  ExistingFile::ExistingFile
            (in_stack_ffffffffffffffc0,(string *)in_stack_ffffffffffffffb8,
             (Options *)in_stack_ffffffffffffffb0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  ExistingFile::getNamer((ExistingFile *)in_stack_ffffffffffffff98._vptr_ApprovalWriter);
  siglen = Options::getReporter(in_RSI);
  FileApprover::verify(local_a8,&stack0xffffffffffffffb8,(size_t)siglen,in_RCX,in_R8);
  ExistingFileNamer::~ExistingFileNamer((ExistingFileNamer *)this);
  ExistingFile::~ExistingFile(this);
  return;
}

Assistant:

static void verifyExistingFile(const std::string& filePath,
                                       const Options& options = Options())
        {
            ExistingFile writer(filePath, options);
            FileApprover::verify(writer.getNamer(), writer, options.getReporter());
        }